

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O0

void hashAndFillAes1Rx4<true>(void *scratchpad,size_t scratchpadSize,void *hash,void *fill_state)

{
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 key_11;
  rx_vec_i128 key_12;
  rx_vec_i128 key_13;
  rx_vec_i128 key_14;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 in_10;
  rx_vec_i128 in_11;
  rx_vec_i128 in_12;
  rx_vec_i128 in_13;
  rx_vec_i128 in_14;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  rx_vec_i128 xkey1;
  rx_vec_i128 xkey0;
  int i;
  char *prefetchPtr;
  int PREFETCH_DISTANCE;
  rx_vec_i128 fill_state3;
  rx_vec_i128 fill_state2;
  rx_vec_i128 fill_state1;
  rx_vec_i128 fill_state0;
  rx_vec_i128 key3;
  rx_vec_i128 key2;
  rx_vec_i128 key1;
  rx_vec_i128 key0;
  rx_vec_i128 hash_state3;
  rx_vec_i128 hash_state2;
  rx_vec_i128 hash_state1;
  rx_vec_i128 hash_state0;
  uint8_t *scratchpadEnd;
  uint8_t *scratchpadPtr;
  longlong in_stack_fffffffffffffbd8;
  longlong lVar1;
  longlong in_stack_fffffffffffffbe0;
  longlong lVar2;
  longlong in_stack_fffffffffffffbe8;
  longlong lVar3;
  int local_3fc;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 *local_328;
  undefined8 *local_320;
  
  local_3b8 = *in_RCX;
  uStack_3b0 = in_RCX[1];
  local_3c8 = in_RCX[2];
  uStack_3c0 = in_RCX[3];
  local_3d8 = in_RCX[4];
  uStack_3d0 = in_RCX[5];
  local_3e8 = in_RCX[6];
  uStack_3e0 = in_RCX[7];
  local_328 = (undefined8 *)((long)in_RDI + in_RSI + -0x1000);
  local_320 = in_RDI;
  for (local_3fc = 0; local_3fc < 2; local_3fc = local_3fc + 1) {
    for (; local_320 < local_328; local_320 = local_320 + 8) {
      in[1] = in_stack_fffffffffffffbe8;
      in[0] = in_stack_fffffffffffffbe0;
      key[1] = in_stack_fffffffffffffbd8;
      key[0] = 0x119eef;
      aesenc<true>(in,key);
      in_00[1] = in_stack_fffffffffffffbe8;
      in_00[0] = in_stack_fffffffffffffbe0;
      key_00[1] = in_stack_fffffffffffffbd8;
      key_00[0] = 0x119f26;
      aesdec<true>(in_00,key_00);
      in_01[1] = in_stack_fffffffffffffbe8;
      in_01[0] = in_stack_fffffffffffffbe0;
      key_01[1] = in_stack_fffffffffffffbd8;
      key_01[0] = 0x119f5d;
      aesenc<true>(in_01,key_01);
      in_02[1] = in_stack_fffffffffffffbe8;
      in_02[0] = in_stack_fffffffffffffbe0;
      key_02[1] = in_stack_fffffffffffffbd8;
      key_02[0] = 0x119f94;
      aesdec<true>(in_02,key_02);
      in_03[1] = in_stack_fffffffffffffbe8;
      in_03[0] = in_stack_fffffffffffffbe0;
      key_03[1] = in_stack_fffffffffffffbd8;
      key_03[0] = 0x119fb1;
      aesdec<true>(in_03,key_03);
      in_04[1] = in_stack_fffffffffffffbe8;
      in_04[0] = in_stack_fffffffffffffbe0;
      key_04[1] = in_stack_fffffffffffffbd8;
      key_04[0] = 0x119fcb;
      aesenc<true>(in_04,key_04);
      in_05[1] = in_stack_fffffffffffffbe8;
      in_05[0] = in_stack_fffffffffffffbe0;
      key_05[1] = in_stack_fffffffffffffbd8;
      key_05[0] = 0x119fe5;
      aesdec<true>(in_05,key_05);
      in_06[1] = in_stack_fffffffffffffbe8;
      in_06[0] = in_stack_fffffffffffffbe0;
      key_06[1] = in_stack_fffffffffffffbd8;
      key_06[0] = 0x119fff;
      aesenc<true>(in_06,key_06);
      *local_320 = extraout_XMM0_Qa;
      local_320[1] = extraout_XMM0_Qb;
      local_320[2] = extraout_XMM0_Qa_00;
      local_320[3] = extraout_XMM0_Qb_00;
      local_320[4] = extraout_XMM0_Qa_01;
      local_320[5] = extraout_XMM0_Qb_01;
      local_320[6] = extraout_XMM0_Qa_02;
      local_320[7] = extraout_XMM0_Qb_02;
      local_3e8 = extraout_XMM0_Qa_02;
      uStack_3e0 = extraout_XMM0_Qb_02;
      local_3d8 = extraout_XMM0_Qa_01;
      uStack_3d0 = extraout_XMM0_Qb_01;
      local_3c8 = extraout_XMM0_Qa_00;
      uStack_3c0 = extraout_XMM0_Qb_00;
      local_3b8 = extraout_XMM0_Qa;
      uStack_3b0 = extraout_XMM0_Qb;
    }
    local_328 = local_328 + 0x200;
  }
  *in_RCX = local_3b8;
  in_RCX[1] = uStack_3b0;
  in_RCX[2] = local_3c8;
  in_RCX[3] = uStack_3c0;
  in_RCX[4] = local_3d8;
  in_RCX[5] = uStack_3d0;
  in_RCX[6] = local_3e8;
  in_RCX[7] = uStack_3e0;
  lVar3 = -0x74db6b6009057c77;
  lVar1 = 0x51f4e03c61b263d1;
  lVar2 = -0x12e7066411efbc3a;
  in_07[1] = -0x74db6b6009057c77;
  in_07[0] = -0x12e7066411efbc3a;
  key_07[1] = 0x51f4e03c61b263d1;
  key_07[0] = 0x11a307;
  aesenc<true>(in_07,key_07);
  in_08[1] = lVar3;
  in_08[0] = lVar2;
  key_08[1] = lVar1;
  key_08[0] = 0x11a324;
  aesdec<true>(in_08,key_08);
  in_09[1] = lVar3;
  in_09[0] = lVar2;
  key_09[1] = lVar1;
  key_09[0] = 0x11a341;
  aesenc<true>(in_09,key_09);
  in_10[1] = lVar3;
  in_10[0] = lVar2;
  key_10[1] = lVar1;
  key_10[0] = 0x11a35e;
  aesdec<true>(in_10,key_10);
  in_11[1] = lVar3;
  in_11[0] = lVar2;
  key_11[1] = lVar1;
  key_11[0] = 0x11a37a;
  aesenc<true>(in_11,key_11);
  in_12[1] = lVar3;
  in_12[0] = lVar2;
  key_12[1] = lVar1;
  key_12[0] = 0x11a396;
  aesdec<true>(in_12,key_12);
  in_13[1] = lVar3;
  in_13[0] = lVar2;
  key_13[1] = lVar1;
  key_13[0] = 0x11a3b2;
  aesenc<true>(in_13,key_13);
  in_14[1] = lVar3;
  in_14[0] = lVar2;
  key_14[1] = lVar1;
  key_14[0] = 0x11a3ce;
  aesdec<true>(in_14,key_14);
  *in_RDX = extraout_XMM0_Qa_03;
  in_RDX[1] = extraout_XMM0_Qb_03;
  in_RDX[2] = extraout_XMM0_Qa_04;
  in_RDX[3] = extraout_XMM0_Qb_04;
  in_RDX[4] = extraout_XMM0_Qa_05;
  in_RDX[5] = extraout_XMM0_Qb_05;
  in_RDX[6] = extraout_XMM0_Qa_06;
  in_RDX[7] = extraout_XMM0_Qb_06;
  return;
}

Assistant:

void hashAndFillAes1Rx4(void *scratchpad, size_t scratchpadSize, void *hash, void* fill_state) {
	uint8_t* scratchpadPtr = (uint8_t*)scratchpad;
	const uint8_t* scratchpadEnd = scratchpadPtr + scratchpadSize;

	// initial state
	rx_vec_i128 hash_state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	rx_vec_i128 hash_state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	rx_vec_i128 hash_state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	rx_vec_i128 hash_state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	const rx_vec_i128 key0 = rx_set_int_vec_i128(AES_GEN_1R_KEY0);
	const rx_vec_i128 key1 = rx_set_int_vec_i128(AES_GEN_1R_KEY1);
	const rx_vec_i128 key2 = rx_set_int_vec_i128(AES_GEN_1R_KEY2);
	const rx_vec_i128 key3 = rx_set_int_vec_i128(AES_GEN_1R_KEY3);

	rx_vec_i128 fill_state0 = rx_load_vec_i128((rx_vec_i128*)fill_state + 0);
	rx_vec_i128 fill_state1 = rx_load_vec_i128((rx_vec_i128*)fill_state + 1);
	rx_vec_i128 fill_state2 = rx_load_vec_i128((rx_vec_i128*)fill_state + 2);
	rx_vec_i128 fill_state3 = rx_load_vec_i128((rx_vec_i128*)fill_state + 3);

	constexpr int PREFETCH_DISTANCE = 4096;
	const char* prefetchPtr = ((const char*)scratchpad) + PREFETCH_DISTANCE;
	scratchpadEnd -= PREFETCH_DISTANCE;

	for (int i = 0; i < 2; ++i) {
		//process 64 bytes at a time in 4 lanes
		while (scratchpadPtr < scratchpadEnd) {
			hash_state0 = aesenc<softAes>(hash_state0, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 0));
			hash_state1 = aesdec<softAes>(hash_state1, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 1));
			hash_state2 = aesenc<softAes>(hash_state2, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 2));
			hash_state3 = aesdec<softAes>(hash_state3, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 3));

			fill_state0 = aesdec<softAes>(fill_state0, key0);
			fill_state1 = aesenc<softAes>(fill_state1, key1);
			fill_state2 = aesdec<softAes>(fill_state2, key2);
			fill_state3 = aesenc<softAes>(fill_state3, key3);

			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 0, fill_state0);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 1, fill_state1);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 2, fill_state2);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 3, fill_state3);

			rx_prefetch_t0(prefetchPtr);

			scratchpadPtr += 64;
			prefetchPtr += 64;
		}
		prefetchPtr = (const char*) scratchpad;
		scratchpadEnd += PREFETCH_DISTANCE;
	}

	rx_store_vec_i128((rx_vec_i128*)fill_state + 0, fill_state0);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 1, fill_state1);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 2, fill_state2);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 3, fill_state3);

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	hash_state0 = aesenc<softAes>(hash_state0, xkey0);
	hash_state1 = aesdec<softAes>(hash_state1, xkey0);
	hash_state2 = aesenc<softAes>(hash_state2, xkey0);
	hash_state3 = aesdec<softAes>(hash_state3, xkey0);

	hash_state0 = aesenc<softAes>(hash_state0, xkey1);
	hash_state1 = aesdec<softAes>(hash_state1, xkey1);
	hash_state2 = aesenc<softAes>(hash_state2, xkey1);
	hash_state3 = aesdec<softAes>(hash_state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, hash_state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, hash_state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, hash_state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, hash_state3);
}